

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int intCallback(int pi,uint user_gpio,uint edge,void *f,void *user,int ex)

{
  int iVar1;
  callback_t *pcVar2;
  CBF_t in_RCX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  void *in_R8;
  int in_R9D;
  callback_t *p;
  int local_4;
  
  if (((in_ESI < 0x20) && (in_EDX < 3)) && (pcVar2 = gCallBackFirst, in_RCX != (CBF_t)0x0)) {
    for (; pcVar2 != (callback_t *)0x0; pcVar2 = pcVar2->next) {
      if (((pcVar2->pi == in_EDI) && (pcVar2->gpio == in_ESI)) &&
         ((pcVar2->edge == in_EDX && (pcVar2->f == in_RCX)))) {
        return -0x7d6;
      }
    }
    pcVar2 = (callback_t *)malloc(0x38);
    if (pcVar2 == (callback_t *)0x0) {
      local_4 = -0x7d7;
    }
    else {
      if (gCallBackFirst == (callback_t *)0x0) {
        gCallBackFirst = pcVar2;
      }
      iVar1 = intCallback::id + 1;
      pcVar2->id = intCallback::id;
      intCallback::id = iVar1;
      pcVar2->pi = in_EDI;
      pcVar2->gpio = in_ESI;
      pcVar2->edge = in_EDX;
      pcVar2->f = in_RCX;
      pcVar2->user = in_R8;
      pcVar2->ex = in_R9D;
      pcVar2->next = (callback_t *)0x0;
      pcVar2->prev = gCallBackLast;
      if (pcVar2->prev != (callback_t *)0x0) {
        pcVar2->prev->next = pcVar2;
      }
      gCallBackLast = pcVar2;
      findNotifyBits((int)((ulong)pcVar2 >> 0x20));
      local_4 = pcVar2->id;
    }
  }
  else {
    local_4 = -0x7d8;
  }
  return local_4;
}

Assistant:

static int intCallback(
   int pi, unsigned user_gpio, unsigned edge, void *f, void *user, int ex)
{
   static int id = 0;
   callback_t *p;

   if ((user_gpio >=0) && (user_gpio < 32) && (edge >=0) && (edge <= 2) && f)
   {
      /* prevent duplicates */

      p = gCallBackFirst;

      while (p)
      {
         if ((p->pi   == pi)        &&
             (p->gpio == user_gpio) &&
             (p->edge == edge)      &&
             (p->f    == f))
         {
            return pigif_duplicate_callback;
         }
         p = p->next;
      }

      p = malloc(sizeof(callback_t));

      if (p)
      {
         if (!gCallBackFirst) gCallBackFirst = p;

         p->id = id++;
         p->pi = pi;
         p->gpio = user_gpio;
         p->edge = edge;
         p->f = f;
         p->user = user;
         p->ex = ex;
         p->next = 0;
         p->prev = gCallBackLast;

         if (p->prev) (p->prev)->next = p;
         gCallBackLast = p;

         findNotifyBits(pi);

         return p->id;
      }

      return pigif_bad_malloc;
   }

   return pigif_bad_callback;
}